

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_interval_recorder.c
# Opt level: O1

int hdr_interval_recorder_init_all
              (hdr_interval_recorder *r,int64_t lowest_discernible_value,
              int64_t highest_trackable_value,int significant_figures)

{
  int iVar1;
  
  r->active = (hdr_histogram *)0x0;
  r->inactive = (hdr_histogram *)0x0;
  iVar1 = hdr_writer_reader_phaser_init(&r->phaser);
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = hdr_init(lowest_discernible_value,highest_trackable_value,significant_figures,&r->active);
  return iVar1;
}

Assistant:

int hdr_interval_recorder_init_all(
    struct hdr_interval_recorder* r,
    int64_t lowest_discernible_value,
    int64_t highest_trackable_value,
    int significant_figures)
{
    int result;

    r->active = r->inactive = NULL;
    result = hdr_writer_reader_phaser_init(&r->phaser);
    result = result == 0
        ? hdr_init(lowest_discernible_value, highest_trackable_value, significant_figures, &r->active)
        : result;

    return result;
}